

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_method_wrapper.cpp
# Opt level: O0

void __thiscall Am_Method_Wrapper::Print(Am_Method_Wrapper *this,ostream *os)

{
  Am_Generic_Procedure *val;
  int iVar1;
  ostream *os_local;
  Am_Method_Wrapper *this_local;
  
  val = this->Call;
  iVar1 = (**(this->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  Am_Standard_Print(os,(unsigned_long)val,(Am_ID_Tag)iVar1);
  return;
}

Assistant:

void
Am_Method_Wrapper::Print(std::ostream &os) const
{
#ifdef DEBUG
  const char *name = Am_Get_Name_Of_Item(this);
  if (name) {
    os << name;
    return;
  }
#endif
  Am_Standard_Print(os, (unsigned long)this->Call, ID());
}